

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_3dmeasure.c
# Opt level: O0

HPDF_STATUS HPDF_3DC3DMeasure_SetTextBoxSize(HPDF_3DMeasure measure,HPDF_INT32 x,HPDF_INT32 y)

{
  HPDF_Array array_00;
  HPDF_STATUS HVar1;
  HPDF_STATUS HVar2;
  HPDF_STATUS ret;
  HPDF_Array array;
  HPDF_INT32 y_local;
  HPDF_INT32 x_local;
  HPDF_3DMeasure measure_local;
  
  array_00 = HPDF_Array_New(measure->mmgr);
  if (array_00 == (HPDF_Array)0x0) {
    measure_local = (HPDF_3DMeasure)HPDF_Error_GetCode(measure->error);
  }
  else {
    measure_local = (HPDF_3DMeasure)HPDF_Dict_Add(measure,"TB",array_00);
    if (measure_local == (HPDF_3DMeasure)0x0) {
      HVar1 = HPDF_Array_AddNumber(array_00,x);
      HVar2 = HPDF_Array_AddNumber(array_00,y);
      measure_local = (HPDF_3DMeasure)(HVar2 + HVar1);
    }
  }
  return (HPDF_STATUS)measure_local;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_3DC3DMeasure_SetTextBoxSize(HPDF_3DMeasure measure, 
							 HPDF_INT32 x,
							 HPDF_INT32 y)
{
	HPDF_Array array;
	HPDF_STATUS ret = HPDF_OK;

	array = HPDF_Array_New (measure->mmgr);
	if (!array)
		return HPDF_Error_GetCode (measure->error);

	ret = HPDF_Dict_Add (measure, "TB", array);
	if (ret != HPDF_OK)
		return ret;

	ret += HPDF_Array_AddNumber(array, x);
	ret += HPDF_Array_AddNumber(array, y);

	return ret;
}